

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeCheckFk(Vdbe *p,int deferred)

{
  long lVar1;
  
  if (deferred == 0) {
    lVar1 = p->nFkConstraint;
  }
  else {
    lVar1 = p->db->nDeferredCons;
  }
  if (0 < lVar1) {
    p->rc = 0x313;
    p->errorAction = '\x02';
    sqlite3SetString(&p->zErrMsg,p->db,"foreign key constraint failed");
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCheckFk(Vdbe *p, int deferred){
  sqlite3 *db = p->db;
  if( (deferred && db->nDeferredCons>0) || (!deferred && p->nFkConstraint>0) ){
    p->rc = SQLITE_CONSTRAINT_FOREIGNKEY;
    p->errorAction = OE_Abort;
    sqlite3SetString(&p->zErrMsg, db, "foreign key constraint failed");
    return SQLITE_ERROR;
  }
  return SQLITE_OK;
}